

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O1

Real * ZBufferGetDepth(Real *__return_storage_ptr__,ZBuffer *zbuffer,uint16_t x,uint16_t y)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (((ushort)((ulong)zbuffer & 0xffffffff) < *(ushort *)__return_storage_ptr__) &&
     (x < *(ushort *)((long)__return_storage_ptr__ + 2))) {
    return (Real *)((ulong)((uint)*(ushort *)((long)__return_storage_ptr__ + 2) * (uint)x +
                           (int)zbuffer) << 4);
  }
  iVar1 = fprintf(_stderr,"%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n","ZBufferGetDepth",
                  (ulong)zbuffer & 0xffffffff,(ulong)*(ushort *)__return_storage_ptr__,x,
                  (uint)*(ushort *)((long)__return_storage_ptr__ + 2));
  return (Real *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Real ZBufferGetDepth(const ZBuffer *zbuffer, uint16_t x, uint16_t y) {
  if (zbuffer->imageWidth <= x || zbuffer->imageHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, zbuffer->imageWidth, y, zbuffer->imageHeight);
#endif
    return DBL_MIN;
  }
  Real depth;
  depth = zbuffer->depths[x + zbuffer->imageHeight * y];
  return depth;
}